

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__bmp_parse_header(stbi__context *s,stbi__bmp_data *info)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  stbi__uint32 sVar5;
  stbi_uc *psVar6;
  stbi_uc *psVar7;
  stbi_uc *psVar8;
  stbi_uc sVar9;
  
  psVar8 = s->img_buffer;
  psVar6 = s->img_buffer_end;
  if (psVar8 < psVar6) {
    psVar7 = psVar8 + 1;
    s->img_buffer = psVar7;
    sVar9 = *psVar8;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_0031b90a;
    psVar8 = s->buffer_start;
    iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar8,s->buflen);
    if (iVar3 == 0) {
      s->read_from_callbacks = 0;
      psVar6 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar9 = '\0';
    }
    else {
      psVar6 = psVar8 + iVar3;
      sVar9 = *psVar8;
    }
    s->img_buffer_end = psVar6;
    psVar7 = s->buffer_start + 1;
    s->img_buffer = psVar7;
  }
  if (sVar9 != 'B') {
LAB_0031b90a:
    stbi__g_failure_reason = "not BMP";
    return (void *)0x0;
  }
  if (psVar7 < psVar6) {
    s->img_buffer = psVar7 + 1;
    sVar9 = *psVar7;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_0031b90a;
    psVar6 = s->buffer_start;
    iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar6,s->buflen);
    if (iVar3 == 0) {
      s->read_from_callbacks = 0;
      psVar8 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar9 = '\0';
    }
    else {
      psVar8 = psVar6 + iVar3;
      sVar9 = *psVar6;
    }
    s->img_buffer_end = psVar8;
    s->img_buffer = s->buffer_start + 1;
  }
  if (sVar9 != 'M') goto LAB_0031b90a;
  stbi__get16le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  uVar2 = stbi__get16le(s);
  iVar3 = stbi__get16le(s);
  info->offset = iVar3 << 0x10 | uVar2;
  uVar2 = stbi__get16le(s);
  iVar3 = stbi__get16le(s);
  uVar2 = iVar3 << 0x10 | uVar2;
  info->hsz = uVar2;
  info->mr = 0;
  info->mg = 0;
  info->mb = 0;
  info->ma = 0;
  if ((int)uVar2 < 0x38) {
    if (uVar2 != 0xc) {
      if (uVar2 != 0x28) goto LAB_0031b93b;
      goto LAB_0031b87e;
    }
    sVar5 = stbi__get16le(s);
    s->img_x = sVar5;
    uVar4 = stbi__get16le(s);
  }
  else {
    if (((uVar2 != 0x38) && (uVar2 != 0x6c)) && (uVar2 != 0x7c)) {
LAB_0031b93b:
      stbi__g_failure_reason = "unknown BMP";
      return (void *)0x0;
    }
LAB_0031b87e:
    uVar4 = stbi__get16le(s);
    iVar3 = stbi__get16le(s);
    s->img_x = iVar3 << 0x10 | uVar4;
    uVar4 = stbi__get16le(s);
    iVar3 = stbi__get16le(s);
    uVar4 = iVar3 << 0x10 | uVar4;
  }
  s->img_y = uVar4;
  iVar3 = stbi__get16le(s);
  if (iVar3 == 1) {
    iVar3 = stbi__get16le(s);
    info->bpp = iVar3;
    if (uVar2 == 0xc) {
      return (void *)0x1;
    }
    uVar4 = stbi__get16le(s);
    iVar3 = stbi__get16le(s);
    if ((uVar4 + iVar3 * 0x10000) - 1 < 2) {
      stbi__g_failure_reason = "BMP RLE";
      return (void *)0x0;
    }
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    if ((int)uVar2 < 0x6c) {
      if (uVar2 != 0x28) {
        if (uVar2 != 0x38) goto LAB_0031baf7;
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
      }
      iVar1 = info->bpp;
      if ((iVar1 != 0x20) && (iVar1 != 0x10)) {
        return (void *)0x1;
      }
      uVar4 = iVar3 * 0x10000 | uVar4;
      if (uVar4 == 3) {
        sVar5 = stbi__get32le(s);
        info->mr = sVar5;
        sVar5 = stbi__get32le(s);
        info->mg = sVar5;
        sVar5 = stbi__get32le(s);
        info->mb = sVar5;
        if (info->mg != sVar5 || info->mr != info->mg) {
          return (void *)0x1;
        }
      }
      else if (uVar4 == 0) {
        if (iVar1 != 0x20) {
          info->mr = 0x7c00;
          info->mg = 0x3e0;
          info->mb = 0x1f;
          return (void *)0x1;
        }
        info->mr = 0xff0000;
        info->mg = 0xff00;
        info->mb = 0xff;
        info->ma = 0xff000000;
        info->all_a = 0;
        return (void *)0x1;
      }
    }
    else if ((uVar2 == 0x6c) || (uVar2 == 0x7c)) {
      sVar5 = stbi__get32le(s);
      info->mr = sVar5;
      sVar5 = stbi__get32le(s);
      info->mg = sVar5;
      sVar5 = stbi__get32le(s);
      info->mb = sVar5;
      sVar5 = stbi__get32le(s);
      info->ma = sVar5;
      stbi__get32le(s);
      iVar3 = 0xc;
      do {
        stbi__get16le(s);
        stbi__get16le(s);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      if (uVar2 != 0x6c) {
        if (uVar2 != 0x7c) {
          return (void *)0x0;
        }
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        return (void *)0x1;
      }
      return (void *)0x1;
    }
  }
LAB_0031baf7:
  stbi__g_failure_reason = "bad BMP";
  return (void *)0x0;
}

Assistant:

static void *stbi__bmp_parse_header(stbi__context *s, stbi__bmp_data *info)
{
   int hsz;
   if (stbi__get8(s) != 'B' || stbi__get8(s) != 'M') return stbi__errpuc("not BMP", "Corrupt BMP");
   stbi__get32le(s); // discard filesize
   stbi__get16le(s); // discard reserved
   stbi__get16le(s); // discard reserved
   info->offset = stbi__get32le(s);
   info->hsz = hsz = stbi__get32le(s);
   info->mr = info->mg = info->mb = info->ma = 0;

   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108 && hsz != 124) return stbi__errpuc("unknown BMP", "BMP type not supported: unknown");
   if (hsz == 12) {
      s->img_x = stbi__get16le(s);
      s->img_y = stbi__get16le(s);
   } else {
      s->img_x = stbi__get32le(s);
      s->img_y = stbi__get32le(s);
   }
   if (stbi__get16le(s) != 1) return stbi__errpuc("bad BMP", "bad BMP");
   info->bpp = stbi__get16le(s);
   if (hsz != 12) {
      int compress = stbi__get32le(s);
      if (compress == 1 || compress == 2) return stbi__errpuc("BMP RLE", "BMP type not supported: RLE");
      stbi__get32le(s); // discard sizeof
      stbi__get32le(s); // discard hres
      stbi__get32le(s); // discard vres
      stbi__get32le(s); // discard colorsused
      stbi__get32le(s); // discard max important
      if (hsz == 40 || hsz == 56) {
         if (hsz == 56) {
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
         }
         if (info->bpp == 16 || info->bpp == 32) {
            if (compress == 0) {
               if (info->bpp == 32) {
                  info->mr = 0xffu << 16;
                  info->mg = 0xffu <<  8;
                  info->mb = 0xffu <<  0;
                  info->ma = 0xffu << 24;
                  info->all_a = 0; // if all_a is 0 at end, then we loaded alpha channel but it was all 0
               } else {
                  info->mr = 31u << 10;
                  info->mg = 31u <<  5;
                  info->mb = 31u <<  0;
               }
            } else if (compress == 3) {
               info->mr = stbi__get32le(s);
               info->mg = stbi__get32le(s);
               info->mb = stbi__get32le(s);
               // not documented, but generated by photoshop and handled by mspaint
               if (info->mr == info->mg && info->mg == info->mb) {
                  // ?!?!?
                  return stbi__errpuc("bad BMP", "bad BMP");
               }
            } else
               return stbi__errpuc("bad BMP", "bad BMP");
         }
      } else {
         int i;
         if (hsz != 108 && hsz != 124)
            return stbi__errpuc("bad BMP", "bad BMP");
         info->mr = stbi__get32le(s);
         info->mg = stbi__get32le(s);
         info->mb = stbi__get32le(s);
         info->ma = stbi__get32le(s);
         stbi__get32le(s); // discard color space
         for (i=0; i < 12; ++i)
            stbi__get32le(s); // discard color space parameters
         if (hsz == 124) {
            stbi__get32le(s); // discard rendering intent
            stbi__get32le(s); // discard offset of profile data
            stbi__get32le(s); // discard size of profile data
            stbi__get32le(s); // discard reserved
         }
      }
   }
   return (void *) 1;
}